

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.hpp
# Opt level: O3

bool __thiscall
trial::protocol::buffer::basic_string<char,_trial::protocol::buffer::base<char>_>::grow
          (basic_string<char,_trial::protocol::buffer::base<char>_> *this,size_type delta)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  
  pbVar1 = this->content;
  uVar4 = delta + pbVar1->_M_string_length + 1;
  uVar2 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(pbVar1->_M_dataplus)._M_p != &pbVar1->field_2) {
    uVar2 = (pbVar1->field_2)._M_allocated_capacity;
  }
  bVar3 = true;
  if (uVar2 < uVar4) {
    if (uVar4 >> 0x3e == 0) {
      std::__cxx11::string::reserve((ulong)pbVar1);
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

virtual bool grow(size_type delta)
    {
        const size_type size = content.size() + delta + 1;
        if (size > content.capacity())
        {
            if (size > content.max_size())
                return false;
            content.reserve(size);
        }
        return true;
    }